

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
RunScriptCore(JsValueRef scriptSource,byte *script,size_t cb,LoadScriptFlag loadScriptFlag,
             JsSourceContext sourceContext,WCHAR *sourceUrl,bool parseOnly,
             JsParseScriptAttributes parseAttributes,bool isSourceModule,JsValueRef *result)

{
  ScriptContext *pSVar1;
  EventLog *this;
  ExecutionInfoManager *this_00;
  code *pcVar2;
  double beginWallTime;
  LoadScriptFlag LVar3;
  bool bVar4;
  JsrtContext *pJVar5;
  SourceContextInfo *pSVar6;
  size_t len;
  ParseableFunctionInfo *pfi;
  FunctionBody *fb;
  TopLevelScriptLoadFunctionBodyResolveInfo *pTVar7;
  undefined4 *puVar8;
  EventLogEntry *pEVar9;
  int64 iVar10;
  Var pvVar11;
  LoadScriptFlag LVar12;
  Type TVar13;
  Var *args;
  JsErrorCode JVar14;
  void *unaff_retaddr;
  undefined1 auStack_208 [8];
  ScriptEntryExitRecord __entryExitRecord;
  Arguments local_1c8;
  EnterScriptObject local_1b8;
  Var local_190;
  Var varThis;
  CompileScriptException se;
  TTDJsRTFunctionCallActionPopperRecorder callInfoPopper;
  undefined1 auStack_e8 [8];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_a8 [8];
  EnterScriptObject __enterScriptObject;
  TTDJsRTActionResultAutoRecorder local_78;
  Utf8SourceInfo *local_60;
  Utf8SourceInfo *utf8SourceInfo;
  AutoNestedHandledExceptionType local_4c;
  WCHAR *pWStack_48;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_1;
  JavascriptFunction *local_40;
  ScriptContext *__localScriptContext;
  
  se.hasLineNumberInfo = false;
  se._81_7_ = 0;
  varThis = (Var)0x0;
  se.super_ScriptException.ichMin = 0;
  se.super_ScriptException.ichLim = 0;
  se.super_ScriptException.ei.wCode = 0;
  se.super_ScriptException.ei.wReserved = 0;
  se.super_ScriptException.ei._4_4_ = 0;
  se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
  se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
  se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
  se.super_ScriptException.ei.dwHelpContext = 0;
  se.super_ScriptException.ei._36_4_ = 0;
  se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
  se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  se.super_ScriptException.ei.scode = 0;
  se.super_ScriptException.ei._60_4_ = 0;
  se.line._0_1_ = 0;
  auStack_a8 = (undefined1  [8])0x0;
  __enterScriptObject.entryExitRecord = (ScriptEntryExitRecord *)0x0;
  utf8SourceInfo = (Utf8SourceInfo *)sourceContext;
  pWStack_48 = sourceUrl;
  pJVar5 = JsrtContext::GetCurrent();
  JVar14 = JsErrorNoCurrentContext;
  if (pJVar5 != (JsrtContext *)0x0) {
    pSVar1 = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)auStack_e8,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (pWStack_48 == (WCHAR *)0x0 || script == (byte *)0x0) {
      JVar14 = JsErrorNullArgument;
    }
    else {
      __enterScriptObject.library = (JavascriptLibrary *)scriptSource;
      pSVar6 = Js::ScriptContext::GetSourceContextInfo
                         (pSVar1,(DWORD_PTR)utf8SourceInfo,(SimpleDataCacheWrapper *)0x0);
      if (pSVar6 == (SourceContextInfo *)0x0) {
        len = PAL_wcslen(pWStack_48);
        pSVar6 = Js::ScriptContext::CreateSourceContextInfo
                           (pSVar1,(DWORD_PTR)utf8SourceInfo,pWStack_48,len,
                            (SimpleDataCacheWrapper *)0x0,(char16 *)0x0,0);
      }
      Memory::Recycler::WBSetBit((char *)&callInfoPopper.m_callAction);
      callInfoPopper.m_callAction = (EventLogEntry *)pSVar6;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&callInfoPopper.m_callAction);
      pEVar9 = (EventLogEntry *)0x0;
      local_60 = (Utf8SourceInfo *)0x0;
      LVar12 = (parseAttributes & JsParseScriptAttributeLibraryCode) << 7 |
               (uint)(result != (JsValueRef *)0x0) | loadScriptFlag;
      LVar3 = LVar12 | LoadScriptFlag_Module;
      if (!isSourceModule) {
        LVar3 = LVar12;
      }
      LVar12 = (parseAttributes & JsParseScriptAttributeStrictMode) << 8 | LVar3;
      if (pSVar1->TTDShouldPerformRecordAction == true) {
        pEVar9 = TTD::EventLog::RecordJsRTCodeParse
                           (pSVar1->threadContext->TTDLog,
                            (TTDJsRTActionResultAutoRecorder *)auStack_a8,LVar12,
                            SUB41((LVar3 & LoadScriptFlag_Utf8Source) >> 6,0),script,(uint32)cb,
                            (uint64)utf8SourceInfo,pWStack_48);
      }
      local_40 = Js::ScriptContext::LoadScript
                           (pSVar1,script,cb,(SRCINFO *)&callInfoPopper.m_callAction,
                            (CompileScriptException *)&varThis,&local_60,L"Global code",LVar12,
                            __enterScriptObject.library);
      if (pSVar1->TTDShouldPerformRecordAction == true) {
        if (__enterScriptObject.entryExitRecord == (ScriptEntryExitRecord *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(JavascriptFunction **)__enterScriptObject.entryExitRecord = local_40;
      }
      if ((local_40 != (JavascriptFunction *)0x0) && (pSVar1->TTDRecordModeEnabled == true)) {
        pfi = Js::JavascriptFunction::GetParseableFunctionInfo(local_40);
        fb = TTD::JsSupport::ForceAndGetFunctionBody(pfi);
        pTVar7 = TTD::EventLog::AddScriptLoad
                           (pSVar1->threadContext->TTDLog,fb,0,(uint64)utf8SourceInfo,script,
                            (uint32)cb,LVar12);
        if (pEVar9 != (EventLogEntry *)0x0) {
          TTD::NSLogEvents::JsRTCodeParseAction_SetBodyCtrId
                    (pEVar9,(pTVar7->TopLevelBase).TopLevelBodyCtr);
        }
        __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
        __entryExitRecord.scriptContext = (ScriptContext *)0x0;
        __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
        __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
        auStack_208 = (undefined1  [8])0x0;
        __entryExitRecord._0_1_ = 0;
        __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
        __entryExitRecord._2_6_ = 0;
        __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
        Js::EnterScriptObject::EnterScriptObject
                  (&local_1b8,pSVar1,(ScriptEntryExitRecord *)auStack_208,unaff_retaddr,
                   &stack0x00000000,true,false,false);
        Js::ScriptContext::OnScriptStart(pSVar1,false,true);
        Js::EnterScriptObject::VerifyEnterScript(&local_1b8);
        TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
                  (pSVar1->TTDContextInfo,fb,(FunctionBody *)0x0);
        TTD::ScriptContextTTD::RegisterLoadedScript
                  (pSVar1->TTDContextInfo,fb,(pTVar7->TopLevelBase).TopLevelBodyCtr);
        Js::EnterScriptObject::~EnterScriptObject(&local_1b8);
      }
      pJVar5 = JsrtContext::GetCurrent();
      JsrtContext::OnScriptLoad(pJVar5,local_40,local_60,(CompileScriptException *)&varThis);
      JVar14 = JsNoError;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)auStack_e8);
  }
  if (auStack_a8 != (undefined1  [8])0x0) {
    if (*(int32 *)((long)auStack_a8 + 4) != -1) goto LAB_00385504;
    *(JsErrorCode *)((long)auStack_a8 + 4) = JVar14;
  }
  if (JVar14 != JsNoError) goto LAB_003854db;
  local_78.m_actionEvent = (EventLogEntry *)0x0;
  local_78.m_resultPtr = (TTDVar *)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  JVar14 = JsErrorNoCurrentContext;
  if (pJVar5 != (JsrtContext *)0x0) {
    pSVar1 = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_4c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    auStack_e8 = (undefined1  [8])0x0;
    ___autoNestedHandledExceptionType = (void *)0x0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)auStack_a8,pSVar1,(ScriptEntryExitRecord *)auStack_e8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(pSVar1,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)auStack_a8);
    if (local_40 == (JavascriptFunction *)0x0) {
      if (pSVar1->TTDShouldPerformRecordAction == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                           ,0xe4b,"(false)","Need to implement support here!!!");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      JVar14 = JsErrorScriptCompile;
      HandleScriptCompileError(pSVar1,(CompileScriptException *)&varThis,pWStack_48);
    }
    else {
      if (parseOnly) {
        if (result == (JsValueRef *)0x0) {
          JVar14 = JsErrorNullArgument;
          goto LAB_003854b3;
        }
        *result = local_40;
      }
      else {
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b0240,EvalCompilePhase);
        args = (Var *)0x0;
        TVar13 = (Type)0x0;
        if (bVar4) {
          local_190 = Js::JavascriptOperators::OP_GetThis
                                ((((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                                 super_JavascriptLibraryBase).undefinedValue.ptr,0,
                                 &pSVar1->super_ScriptContextInfo);
          args = &local_190;
          TVar13 = (Type)0x4000001;
        }
        TTD::TTDJsRTFunctionCallActionPopperRecorder::TTDJsRTFunctionCallActionPopperRecorder
                  ((TTDJsRTFunctionCallActionPopperRecorder *)&se.bstrLine);
        if (pSVar1->TTDShouldPerformRecordAction == true) {
          pEVar9 = TTD::EventLog::RecordJsRTCallFunction
                             (pSVar1->threadContext->TTDLog,&local_78,
                              pSVar1->threadContext->TTDRootNestingCount,local_40,TVar13._0_4_ & 1,
                              args);
          beginWallTime = TTD::EventLog::GetCurrentWallTime(pSVar1->threadContext->TTDLog);
          TTD::TTDJsRTFunctionCallActionPopperRecorder::InitializeForRecording
                    ((TTDJsRTFunctionCallActionPopperRecorder *)&se.bstrLine,pSVar1,beginWallTime,
                     pEVar9);
          if (pSVar1->threadContext->TTDRootNestingCount == 0) {
            this = pSVar1->threadContext->TTDLog;
            iVar10 = TTD::EventLog::GetLastEventTime(this);
            TTD::EventLog::ResetCallStackForTopLevelCall(this,iVar10);
            this_00 = pSVar1->threadContext->TTDExecutionInfo;
            if (this_00 != (ExecutionInfoManager *)0x0) {
              iVar10 = TTD::EventLog::GetLastEventTime(this);
              TTD::ExecutionInfoManager::ResetCallStackForTopLevelCall(this_00,iVar10);
            }
          }
        }
        local_1c8.Info = TVar13;
        local_1c8.Values = args;
        pvVar11 = Js::JavascriptFunction::CallRootFunction(local_40,&local_1c8,pSVar1,true);
        if (result != (JsValueRef *)0x0) {
          *result = pvVar11;
        }
        if (pSVar1->TTDShouldPerformRecordAction == true) {
          if (local_78.m_resultPtr == (TTDVar *)0x0) {
            TTDAbort_unrecoverable_error("Why are we calling this then???");
          }
          if (result != (JsValueRef *)0x0) {
            *local_78.m_resultPtr = *result;
          }
        }
        TTD::TTDJsRTFunctionCallActionPopperRecorder::~TTDJsRTFunctionCallActionPopperRecorder
                  ((TTDJsRTFunctionCallActionPopperRecorder *)&se.bstrLine);
      }
      JVar14 = JsNoError;
    }
LAB_003854b3:
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)auStack_a8);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_4c);
  }
  if (local_78.m_actionEvent != (EventLogEntry *)0x0) {
    if ((local_78.m_actionEvent)->ResultStatus != -1) {
LAB_00385504:
      TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
    }
    (local_78.m_actionEvent)->ResultStatus = JVar14;
  }
LAB_003854db:
  CompileScriptException::~CompileScriptException((CompileScriptException *)&varThis);
  return JVar14;
}

Assistant:

JsErrorCode RunScriptCore(JsValueRef scriptSource, const byte *script, size_t cb,
    LoadScriptFlag loadScriptFlag, JsSourceContext sourceContext,
    const WCHAR *sourceUrl, bool parseOnly, JsParseScriptAttributes parseAttributes,
    bool isSourceModule, JsValueRef *result)
{
    Js::JavascriptFunction *scriptFunction;
    CompileScriptException se;

    JsErrorCode errorCode = ContextAPINoScriptWrapper([&](Js::ScriptContext * scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PARAM_NOT_NULL(script);
        PARAM_NOT_NULL(sourceUrl);

        SourceContextInfo * sourceContextInfo = scriptContext->GetSourceContextInfo(sourceContext, nullptr);

        if (sourceContextInfo == nullptr)
        {
            sourceContextInfo = scriptContext->CreateSourceContextInfo(sourceContext, sourceUrl, wcslen(sourceUrl), nullptr);
        }

        const int chsize = (loadScriptFlag & LoadScriptFlag_Utf8Source) ?
            sizeof(utf8char_t) : sizeof(WCHAR);

        SRCINFO si = {
            /* sourceContextInfo   */ sourceContextInfo,
            /* dlnHost             */ 0,
            /* ulColumnHost        */ 0,
            /* lnMinHost           */ 0,
            /* ichMinHost          */ 0,
            /* ichLimHost          */ static_cast<ULONG>(cb / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
            /* ulCharOffset        */ 0,
            /* mod                 */ kmodGlobal,
            /* grfsi               */ 0
        };

        Js::Utf8SourceInfo* utf8SourceInfo = nullptr;
        if (result != nullptr)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_Expression);
        }
        bool isLibraryCode = (parseAttributes & JsParseScriptAttributeLibraryCode) == JsParseScriptAttributeLibraryCode;
        bool isStrictMode = (parseAttributes & JsParseScriptAttributeStrictMode) == JsParseScriptAttributeStrictMode;
        if (isLibraryCode)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_LibraryCode);
        }
        if (isSourceModule)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_Module);
        }
        if (isStrictMode)
        {
            loadScriptFlag = (LoadScriptFlag)(loadScriptFlag | LoadScriptFlag_StrictMode);
        }

#if ENABLE_TTD
        TTD::NSLogEvents::EventLogEntry* parseEvent = nullptr;
        if (PERFORM_JSRT_TTD_RECORD_ACTION_CHECK(scriptContext))
        {
            parseEvent = scriptContext->GetThreadContext()->TTDLog->RecordJsRTCodeParse(_actionEntryPopper,
                loadScriptFlag, ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source),
                script, (uint32)cb, sourceContext, sourceUrl);
        }
#endif

        scriptFunction = scriptContext->LoadScript(script, cb,
            &si, &se, &utf8SourceInfo,
            Js::Constants::GlobalCode, loadScriptFlag, scriptSource);

#if ENABLE_TTD
        if(PERFORM_JSRT_TTD_RECORD_ACTION_CHECK(scriptContext))
        {
            _actionEntryPopper.SetResult((Js::Var*)&scriptFunction);
        }

        //
        //TODO: We may (probably?) want to use the debugger source rundown functionality here instead
        //
        if (scriptFunction != nullptr && scriptContext->IsTTDRecordModeEnabled())
        {
            //Make sure we have the body and text information available
            Js::FunctionBody* globalBody = TTD::JsSupport::ForceAndGetFunctionBody(scriptFunction->GetParseableFunctionInfo());

            const TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo* tbfi = scriptContext->GetThreadContext()->TTDLog->AddScriptLoad(globalBody, kmodGlobal, sourceContext, script, (uint32)cb, loadScriptFlag);
            if(parseEvent != nullptr)
            {
                TTD::NSLogEvents::JsRTCodeParseAction_SetBodyCtrId(parseEvent, tbfi->TopLevelBase.TopLevelBodyCtr);
            }

            //walk global body to (1) add functions to pin set (2) build parent map
            BEGIN_JS_RUNTIME_CALL(scriptContext);
            {
                scriptContext->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                scriptContext->TTDContextInfo->RegisterLoadedScript(globalBody, tbfi->TopLevelBase.TopLevelBodyCtr);
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }
#endif

        JsrtContext * context = JsrtContext::GetCurrent();
        context->OnScriptLoad(scriptFunction, utf8SourceInfo, &se);

        return JsNoError;
    });

    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    return ContextAPIWrapper<false>([&](Js::ScriptContext* scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        if (scriptFunction == nullptr)
        {
            PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

            HandleScriptCompileError(scriptContext, &se, sourceUrl);
            return JsErrorScriptCompile;
        }

        if (parseOnly)
        {
            PARAM_NOT_NULL(result);
            *result = scriptFunction;
        }
        else
        {
            Js::Arguments args(0, nullptr);
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            Js::Var varThis;
            if (PHASE_FORCE1(Js::EvalCompilePhase))
            {
                varThis = Js::JavascriptOperators::OP_GetThis(scriptContext->GetLibrary()->GetUndefined(), kmodGlobal, scriptContext);
                args.Info.Flags = (Js::CallFlags)Js::CallFlags::CallFlags_Eval;
                args.Info.Count = 1;
                args.Values = &varThis;
            }
#endif

#if ENABLE_TTD
            TTD::TTDJsRTFunctionCallActionPopperRecorder callInfoPopper;
            if(PERFORM_JSRT_TTD_RECORD_ACTION_CHECK(scriptContext))
            {
                TTD::NSLogEvents::EventLogEntry* callEvent = scriptContext->GetThreadContext()->TTDLog->RecordJsRTCallFunction(_actionEntryPopper, scriptContext->GetThreadContext()->TTDRootNestingCount, scriptFunction, args.Info.Count, args.Values);
                callInfoPopper.InitializeForRecording(scriptContext, scriptContext->GetThreadContext()->TTDLog->GetCurrentWallTime(), callEvent);

                if(scriptContext->GetThreadContext()->TTDRootNestingCount == 0)
                {
                    TTD::EventLog* elog = scriptContext->GetThreadContext()->TTDLog;
                    elog->ResetCallStackForTopLevelCall(elog->GetLastEventTime());

                    TTD::ExecutionInfoManager* emanager = scriptContext->GetThreadContext()->TTDExecutionInfo;
                    if(emanager != nullptr)
                    {
                        emanager->ResetCallStackForTopLevelCall(elog->GetLastEventTime());
                    }
                }
            }
#endif

            Js::Var varResult = scriptFunction->CallRootFunction(args, scriptContext, true);
            if (result != nullptr)
            {
                *result = varResult;
            }

#if ENABLE_TTD
            if(PERFORM_JSRT_TTD_RECORD_ACTION_CHECK(scriptContext))
            {
                _actionEntryPopper.SetResult(result);
            }
#endif
        }
        return JsNoError;
    });
}